

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O0

void TranslateModuleTypeDefinitions(ExpressionTranslateContext *ctx)

{
  uint uVar1;
  TypeBase **ppTVar2;
  TypeBase *type;
  uint i;
  ExpressionTranslateContext *ctx_local;
  
  PrintIndentedLine(ctx,"// Type definitions");
  PrintIndentedLine(ctx,"#pragma pack(push, 4)");
  type._4_4_ = 0;
  while( true ) {
    uVar1 = SmallArray<TypeBase_*,_128U>::size(&ctx->ctx->types);
    if (uVar1 <= type._4_4_) break;
    ppTVar2 = SmallArray<TypeBase_*,_128U>::operator[](&ctx->ctx->types,type._4_4_);
    TranslateTypeDefinition(ctx,*ppTVar2);
    type._4_4_ = type._4_4_ + 1;
  }
  PrintIndentedLine(ctx,"#pragma pack(pop)");
  PrintLine(ctx);
  return;
}

Assistant:

void TranslateModuleTypeDefinitions(ExpressionTranslateContext &ctx)
{
	PrintIndentedLine(ctx, "// Type definitions");
	PrintIndentedLine(ctx, "#pragma pack(push, 4)");

	for(unsigned i = 0; i < ctx.ctx.types.size(); i++)
	{
		TypeBase *type = ctx.ctx.types[i];

		TranslateTypeDefinition(ctx, type);
	}
	PrintIndentedLine(ctx, "#pragma pack(pop)");

	PrintLine(ctx);
}